

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::remap_descriptor_set_layout_handle
          (Impl *this,VkDescriptorSetLayout layout,VkDescriptorSetLayout *out_layout)

{
  ulong uVar1;
  bool bVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  bool bVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  long *in_FS_OFFSET;
  
  if (layout == (VkDescriptorSetLayout)0x0) {
    *out_layout = (VkDescriptorSetLayout)0x0;
    bVar5 = true;
  }
  else {
    uVar1 = (this->descriptor_set_layout_to_hash)._M_h._M_bucket_count;
    uVar4 = (ulong)layout % uVar1;
    p_Var6 = (this->descriptor_set_layout_to_hash)._M_h._M_buckets[uVar4];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6,
       (VkDescriptorSetLayout)p_Var6->_M_nxt[1]._M_nxt != layout)) {
      while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var7 = p_Var6, (VkDescriptorSetLayout)p_Var3[1]._M_nxt == layout)) goto LAB_0016c19a;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_0016c19a:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var7->_M_nxt;
    }
    bVar5 = p_Var3 != (_Hash_node_base *)0x0;
    if (p_Var3 == (_Hash_node_base *)0x0) {
      if ((*(int *)(*in_FS_OFFSET + -0x20) < 2) &&
         (bVar2 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Cannot find descriptor set layout in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                            ), !bVar2)) {
        remap_descriptor_set_layout_handle();
      }
    }
    else {
      *out_layout = (VkDescriptorSetLayout)p_Var3[2]._M_nxt;
    }
  }
  return bVar5;
}

Assistant:

bool StateRecorder::Impl::remap_descriptor_set_layout_handle(VkDescriptorSetLayout layout,
                                                             VkDescriptorSetLayout *out_layout) const
{
	if (layout == VK_NULL_HANDLE)
	{
		// This is allowed in VK_EXT_graphics_pipeline_library.
		*out_layout = VK_NULL_HANDLE;
		return true;
	}

	auto itr = descriptor_set_layout_to_hash.find(layout);
	if (itr == end(descriptor_set_layout_to_hash))
	{
		LOGW_LEVEL("Cannot find descriptor set layout in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_layout = api_object_cast<VkDescriptorSetLayout>(uint64_t(itr->second));
		return true;
	}
}